

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::ParseableFunctionInfo::Copy(ParseableFunctionInfo *this,ParseableFunctionInfo *other)

{
  ScopeInfo *scopeInfo;
  DeferredFunctionStub *stub;
  PrintOffsets *offsets;
  RecyclerWeakReference<Js::JavascriptString> *weakRef;
  PropertyId *propertyIdsForScopeSlotArray;
  PropertyId *propertyIds;
  ParseableFunctionInfo *other_local;
  ParseableFunctionInfo *this_local;
  
  FunctionProxy::Copy(&this->super_FunctionProxy,&other->super_FunctionProxy);
  other->flags = this->flags;
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator=
            (&other->crossSiteDeferredFunctionType,&this->crossSiteDeferredFunctionType);
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator=
            (&other->crossSiteUndeferredFunctionType,&this->crossSiteUndeferredFunctionType);
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       *(ushort *)&(other->super_FunctionProxy).field_0x45 & 0xfffb |
       (*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 2 & 1) << 2;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       *(ushort *)&(other->super_FunctionProxy).field_0x45 & 0xfff7 |
       (*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 3 & 1) << 3;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       *(ushort *)&(other->super_FunctionProxy).field_0x45 & 0xfeff |
       (*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 8 & 1) << 8;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       *(ushort *)&(other->super_FunctionProxy).field_0x45 & 0xefff |
       (*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 0xc & 1) << 0xc;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       *(ushort *)&(other->super_FunctionProxy).field_0x45 & 0xdfff |
       (*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 0xd & 1) << 0xd;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       *(ushort *)&(other->super_FunctionProxy).field_0x45 & 0xbfff |
       (*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 0xe & 1) << 0xe;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       *(ushort *)&(other->super_FunctionProxy).field_0x45 & 0x7fff |
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x8000;
  (other->super_FunctionProxy).field_0x47 =
       (other->super_FunctionProxy).field_0x47 & 0xfe | (this->super_FunctionProxy).field_0x47 & 1;
  (other->super_FunctionProxy).field_0x47 =
       (other->super_FunctionProxy).field_0x47 & 0xfd |
       ((byte)(this->super_FunctionProxy).field_0x47 >> 1 & 1) << 1;
  (other->super_FunctionProxy).field_0x47 =
       (other->super_FunctionProxy).field_0x47 & 0xfb |
       ((byte)(this->super_FunctionProxy).field_0x47 >> 2 & 1) << 2;
  (other->super_FunctionProxy).field_0x47 =
       (other->super_FunctionProxy).field_0x47 & 0xf7 |
       ((byte)(this->super_FunctionProxy).field_0x47 >> 3 & 1) << 3;
  other->m_inParamCount = this->m_inParamCount;
  other->m_grfscr = this->m_grfscr;
  scopeInfo = GetScopeInfo(this);
  SetScopeInfo(other,scopeInfo);
  stub = GetDeferredStubs(this);
  SetDeferredStubs(other,stub);
  offsets = GetPrintOffsets(this);
  SetPrintOffsets(other,offsets);
  (other->super_FunctionProxy).field_0x47 =
       (other->super_FunctionProxy).field_0x47 & 0x7f |
       (this->super_FunctionProxy).field_0x47 & 0x80;
  other->deferredParseNextFunctionId = this->deferredParseNextFunctionId;
  other->scopeObjectSize = this->scopeObjectSize;
  other->scopeSlotArraySize = this->scopeSlotArraySize;
  other->paramScopeSlotArraySize = this->paramScopeSlotArraySize;
  weakRef = GetCachedSourceStringWeakRef(this);
  SetCachedSourceStringWeakRef(other,weakRef);
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       *(ushort *)&(other->super_FunctionProxy).field_0x45 & 0xfdff |
       (*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 9 & 1) << 9;
  *(ushort *)&(other->super_FunctionProxy).field_0x45 =
       *(ushort *)&(other->super_FunctionProxy).field_0x45 & 0xfbff |
       (*(ushort *)&(this->super_FunctionProxy).field_0x45 >> 10 & 1) << 10;
  propertyIdsForScopeSlotArray = GetPropertyIdsForScopeSlotArray(this);
  if (propertyIdsForScopeSlotArray != (PropertyId *)0x0) {
    SetPropertyIdsForScopeSlotArray
              (other,propertyIdsForScopeSlotArray,this->scopeSlotArraySize,
               this->paramScopeSlotArraySize);
  }
  other->m_sourceIndex = this->m_sourceIndex;
  other->m_cchStartOffset = this->m_cchStartOffset;
  other->m_cchLength = this->m_cchLength;
  other->m_lineNumber = this->m_lineNumber;
  other->m_columnNumber = this->m_columnNumber;
  other->m_cbStartOffset = this->m_cbStartOffset;
  other->m_cbLength = this->m_cbLength;
  CopyNestedArray(this,other);
  return;
}

Assistant:

void ParseableFunctionInfo::Copy(ParseableFunctionInfo * other)
    {
        __super::Copy(other);

#define CopyDeferParseField(field) other->field = this->field;
        CopyDeferParseField(flags);
        CopyDeferParseField(crossSiteDeferredFunctionType);
        CopyDeferParseField(crossSiteUndeferredFunctionType);
        CopyDeferParseField(m_isDeclaration);
        CopyDeferParseField(m_isAccessor);
        CopyDeferParseField(m_isStrictMode);
        CopyDeferParseField(m_isGlobalFunc);
        CopyDeferParseField(m_doBackendArgumentsOptimization);
        CopyDeferParseField(m_doScopeObjectCreation);
        CopyDeferParseField(m_usesArgumentsObject);
        CopyDeferParseField(m_isEval);
        CopyDeferParseField(m_isDynamicFunction);
        CopyDeferParseField(m_hasImplicitArgIns);
        CopyDeferParseField(m_dontInline);
        CopyDeferParseField(m_inParamCount);
        CopyDeferParseField(m_grfscr);
        other->SetScopeInfo(this->GetScopeInfo());
        other->SetDeferredStubs(this->GetDeferredStubs());
        other->SetPrintOffsets(this->GetPrintOffsets());
        CopyDeferParseField(m_utf8SourceHasBeenSet);
#if DBG
        CopyDeferParseField(deferredParseNextFunctionId);
        CopyDeferParseField(scopeObjectSize);
#endif
        CopyDeferParseField(scopeSlotArraySize);
        CopyDeferParseField(paramScopeSlotArraySize);
        other->SetCachedSourceStringWeakRef(this->GetCachedSourceStringWeakRef());
        CopyDeferParseField(m_isAsmjsMode);
        CopyDeferParseField(m_isAsmJsFunction);

        PropertyId * propertyIds = this->GetPropertyIdsForScopeSlotArray();
        if (propertyIds != nullptr)
        {
            other->SetPropertyIdsForScopeSlotArray(propertyIds, this->scopeSlotArraySize, this->paramScopeSlotArraySize);
        }

        CopyDeferParseField(m_sourceIndex);
        CopyDeferParseField(m_cchStartOffset);
        CopyDeferParseField(m_cchLength);
        CopyDeferParseField(m_lineNumber);
        CopyDeferParseField(m_columnNumber);
        CopyDeferParseField(m_cbStartOffset);
        CopyDeferParseField(m_cbLength);

        this->CopyNestedArray(other);
#undef CopyDeferParseField
   }